

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write_decimal<int>
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,int value)

{
  undefined2 uVar1;
  buffer<wchar_t> *pbVar2;
  size_t sVar3;
  undefined1 *puVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  wchar_t *__dest;
  ulong uVar10;
  undefined1 uVar12;
  undefined1 auVar11 [16];
  wchar_t buffer [20];
  undefined1 auStack_88 [88];
  
  uVar9 = (ulong)(uint)-value;
  if (0 < value) {
    uVar9 = (ulong)(uint)value;
  }
  uVar5 = (uint)uVar9;
  uVar7 = 0x1f;
  if ((uVar5 | 1) != 0) {
    for (; (uVar5 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  uVar7 = (uVar7 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar8 = (ulong)((uVar7 - (uVar5 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32 +
                                             (ulong)uVar7 * 4))) + 1);
  pbVar2 = (this->out_).container;
  sVar3 = pbVar2->size_;
  uVar10 = ((uint)value >> 0x1f) + sVar3 + uVar8;
  if (pbVar2->capacity_ < uVar10) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar10);
  }
  __dest = pbVar2->ptr_ + sVar3;
  pbVar2->size_ = uVar10;
  if (value < 0) {
    *__dest = L'-';
    __dest = __dest + 1;
  }
  puVar4 = auStack_88 + uVar8 * 4;
  if (99 < uVar5) {
    do {
      uVar7 = (uint)uVar9;
      uVar5 = (uint)(uVar9 / 100);
      uVar9 = uVar9 / 100;
      uVar1 = *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar7 + (int)uVar9 * -100) * 2);
      uVar12 = (undefined1)((ushort)uVar1 >> 8);
      auVar11 = ZEXT416(CONCAT22((short)(CONCAT13(uVar12,CONCAT12(uVar12,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar11 = pshuflw(auVar11,auVar11,0x60);
      *(ulong *)(puVar4 + -8) = CONCAT44(auVar11._4_4_ >> 0x18,auVar11._0_4_ >> 0x18);
      puVar4 = puVar4 + -8;
    } while (9999 < uVar7);
  }
  if (uVar5 < 10) {
    uVar5 = uVar5 | 0x30;
    lVar6 = -4;
  }
  else {
    *(int *)(puVar4 + -4) = (int)(char)basic_data<void>::digits[((ulong)uVar5 * 2 & 0xffffffff) + 1]
    ;
    uVar5 = (uint)(char)basic_data<void>::digits[(ulong)uVar5 * 2];
    lVar6 = -8;
  }
  *(uint *)(puVar4 + lVar6) = uVar5;
  if (uVar8 != 0) {
    switchD_00b1422a::default(__dest,auStack_88,uVar8 << 2);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }